

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::OurReader::readString(OurReader *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  cVar1 = '\0';
  pcVar3 = this->current_;
  do {
    while( true ) {
      pcVar2 = pcVar3;
      if (pcVar2 == this->end_) goto LAB_0011e6b0;
      pcVar3 = pcVar2 + 1;
      this->current_ = pcVar3;
      cVar1 = *pcVar2;
      if (cVar1 != '\\') break;
      if (pcVar3 != this->end_) {
        this->current_ = pcVar2 + 2;
        pcVar3 = pcVar2 + 2;
      }
    }
  } while (cVar1 != '\"');
LAB_0011e6b0:
  return cVar1 == '\"';
}

Assistant:

bool OurReader::readString() {
  Char c = 0;
  while (current_ != end_) {
    c = getNextChar();
    if (c == '\\')
      getNextChar();
    else if (c == '"')
      break;
  }
  return c == '"';
}